

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<float,_long,_1,_2,_false,_0,_0,_1>::run
               (long size,long otherSize,float *_tri,long triStride,float *_other,long otherIncr,
               long otherStride,level3_blocking<float,_float> *blocking)

{
  ulong size_00;
  size_t size_01;
  float fVar1;
  float *pfVar2;
  LhsScalar *pLVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  float *depth;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  long lVar20;
  float *pfVar21;
  long j;
  long lVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  long i3;
  float *pfVar26;
  float *pfVar27;
  float fVar28;
  float afStack_1b8 [2];
  ptrdiff_t local_1b0;
  ptrdiff_t l1;
  ptrdiff_t l3;
  aligned_stack_memory_handler<float> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<float> blockB_stack_memory_destructor;
  ptrdiff_t l2;
  long startTarget;
  float *local_d0;
  long local_c0;
  float *local_b8;
  long actual_kc;
  blas_data_mapper<float,_long,_0,_0,_1> local_68;
  float *local_58;
  LhsScalar *local_50;
  gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
  local_41;
  float *pfStack_40;
  gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  local_32;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
  local_31 [7];
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
  pack_lhs;
  
  pfVar4 = afStack_1b8;
  if (otherIncr == 1) {
    pfVar2 = (float *)blocking->m_kc;
    lVar24 = blocking->m_mc;
    if (size <= blocking->m_mc) {
      lVar24 = size;
    }
    pfVar25 = (float *)(lVar24 * (long)pfVar2);
    pfStack_40 = (float *)size;
    if ((ulong)pfVar25 >> 0x3e != 0) {
      throw_std_bad_alloc();
    }
    pfVar26 = (float *)((long)pfVar2 * otherSize);
    local_50 = blocking->m_blockA;
    size_00 = (long)pfVar25 * 4;
    if (local_50 == (LhsScalar *)0x0) {
      if (size_00 < 0x20001) {
        l3 = (long)afStack_1b8 - (size_00 + 0x1e & 0xfffffffffffffff0);
        blockA_stack_memory_destructor.m_size._0_1_ = false;
        pfVar4 = (float *)l3;
        local_50 = (LhsScalar *)l3;
      }
      else {
        local_50 = (LhsScalar *)aligned_malloc(size_00);
        l3 = (ptrdiff_t)(LhsScalar *)0x0;
        if (blocking->m_blockA == (LhsScalar *)0x0) {
          l3 = (ptrdiff_t)local_50;
        }
        blockA_stack_memory_destructor.m_size._0_1_ = true;
      }
    }
    else {
      blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
      l3 = 0;
      pfVar4 = afStack_1b8;
    }
    blockA_stack_memory_destructor.m_ptr = pfVar25;
    if ((float *)0x3fffffffffffffff < pfVar26) {
      pfVar4[-2] = 2.142292e-39;
      pfVar4[-1] = 0.0;
      throw_std_bad_alloc();
    }
    size_01 = (long)pfVar26 * 4;
    if (blocking->m_blockB == (float *)0x0) {
      if (size_01 < 0x20001) {
        pfVar4 = (float *)((long)pfVar4 - (size_01 + 0x1e & 0xfffffffffffffff0));
        blockA_stack_memory_destructor._16_8_ = pfVar4;
        pfVar25 = pfVar4;
      }
      else {
        pfVar4[-2] = 2.142378e-39;
        pfVar4[-1] = 0.0;
        pfVar25 = (float *)aligned_malloc(size_01);
        blockA_stack_memory_destructor._16_8_ = (float *)0x0;
        if (blocking->m_blockB == (RhsScalar *)0x0) {
          blockA_stack_memory_destructor._16_8_ = pfVar25;
        }
      }
    }
    else {
      blockA_stack_memory_destructor._16_8_ = (float *)0x0;
      pfVar25 = blocking->m_blockB;
    }
    blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_01;
    blockB_stack_memory_destructor.m_ptr = pfVar26;
    pfVar4[-2] = 2.142476e-39;
    pfVar4[-1] = 0.0;
    manage_caching_sizes
              (GetAction,&local_1b0,(ptrdiff_t *)&blockB_stack_memory_destructor.m_deallocate,&l1);
    pfVar4[-2] = 5.60519e-45;
    pfVar26 = pfStack_40;
    pfVar4[-1] = 0.0;
    if (otherSize < 1) {
      lVar5 = 0;
    }
    else {
      pfVar8 = pfStack_40;
      if ((long)pfStack_40 < otherStride) {
        pfVar8 = (float *)otherStride;
      }
      lVar5 = (long)((ulong)blockB_stack_memory_destructor._16_8_ / (ulong)((long)pfVar8 << 4)) /
              *(long *)(pfVar4 + -2) << 2;
    }
    lVar16 = *(long *)(pfVar4 + -2);
    if (4 < lVar5) {
      lVar16 = lVar5;
    }
    pfVar8 = _other + (long)pfStack_40;
    local_d0 = _tri + (long)(((long)pfStack_40 + -1) * triStride + (long)pfStack_40);
    local_c0 = (long)pfStack_40 - (long)pfVar2;
    local_b8 = _tri + triStride * local_c0;
    pfVar4[-2] = 1.12104e-44;
    pfVar4[-1] = 0.0;
    pfVar21 = *(float **)(pfVar4 + -2);
    while( true ) {
      depth = pfVar26;
      if ((long)pfVar2 < (long)pfVar26) {
        depth = pfVar2;
      }
      if ((long)pfVar26 < 1) break;
      pfStack_40 = pfVar26;
      pfVar12 = pfVar8;
      for (lVar5 = 0; lVar6 = otherSize - lVar5, lVar6 != 0 && lVar5 <= otherSize;
          lVar5 = lVar5 + lVar16) {
        if (lVar16 < lVar6) {
          lVar6 = lVar16;
        }
        lVar23 = 0;
        pfVar9 = depth;
        pfVar13 = local_d0;
        pfVar19 = pfVar12;
        while( true ) {
          pfVar10 = pfVar21;
          if ((long)pfVar9 < 8) {
            pfVar10 = pfVar9;
          }
          pfVar7 = (float *)0x0;
          if (0 < (long)pfVar10) {
            pfVar7 = pfVar10;
          }
          pfVar17 = (float *)((long)depth - lVar23);
          if (pfVar17 == (float *)0x0 || (long)depth < lVar23) break;
          lVar11 = -(long)pfVar10;
          pfVar14 = pfVar13 + -(long)pfVar10;
          if ((long)pfVar17 < 8) {
            pfVar21 = pfVar17;
          }
          pfVar15 = (float *)0x0;
          local_58 = pfVar21;
          while( true ) {
            pfVar10 = (float *)((long)pfVar10 + -1);
            pfVar18 = (float *)0x0;
            if (0 < (long)pfVar10) {
              pfVar18 = pfVar10;
            }
            if (pfVar15 == pfVar7) break;
            lVar20 = ~((long)pfVar15 + lVar23) + (long)pfStack_40;
            fVar1 = _tri[lVar20 * triStride + lVar20];
            pfVar21 = pfVar19 + lVar11;
            for (lVar22 = lVar5; lVar22 < lVar6 + lVar5; lVar22 = lVar22 + 1) {
              fVar28 = _other[lVar22 * otherStride + lVar20] * (1.0 / fVar1);
              _other[lVar22 * otherStride + lVar20] = fVar28;
              for (pfVar27 = (float *)0x0; pfVar18 != pfVar27;
                  pfVar27 = (float *)((long)pfVar27 + 1)) {
                pfVar21[(long)pfVar27] = pfVar14[(long)pfVar27] * -fVar28 + pfVar21[(long)pfVar27];
              }
              pfVar21 = pfVar21 + otherStride;
            }
            pfVar15 = (float *)((long)pfVar15 + 1);
            pfVar14 = pfVar14 + -triStride;
            pfVar21 = local_58;
          }
          lVar22 = (long)pfVar17 - (long)pfVar21;
          lVar11 = (long)pfStack_40 + (-(long)pfVar21 - lVar23);
          local_68.m_data = _other + lVar5 * otherStride + lVar11;
          local_68.m_stride = otherStride;
          *(long *)(pfVar4 + -4) = lVar22;
          pfVar4[-6] = 2.143701e-39;
          pfVar4[-5] = 0.0;
          gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
          ::operator()(&local_41,pfVar25 + lVar5 * (long)depth,&local_68,(long)pfVar21,lVar6,
                       (long)depth,*(long *)(pfVar4 + -4));
          pLVar3 = local_50;
          pfVar21 = local_58;
          if (0 < lVar22) {
            local_68.m_data = _tri + (long)pfVar26 + (lVar11 * triStride - (long)depth);
            local_68.m_stride = triStride;
            pfVar4[-4] = 0.0;
            pfVar4[-3] = 0.0;
            pfVar4[-6] = 2.14381e-39;
            pfVar4[-5] = 0.0;
            gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
            ::operator()(local_31,pLVar3,(const_blas_data_mapper<float,_long,_0> *)&local_68,
                         (long)pfVar21,lVar22,0,*(long *)(pfVar4 + -4));
            pLVar3 = local_50;
            pfVar21 = local_58;
            local_68.m_data = _other + (long)pfVar26 + (lVar5 * otherStride - (long)depth);
            local_68.m_stride = otherStride;
            *(long *)(pfVar4 + -4) = lVar22;
            pfVar4[-6] = 0.0;
            pfVar4[-5] = 0.0;
            *(float **)(pfVar4 + -8) = depth;
            *(float **)(pfVar4 + -10) = pfVar21;
            *(long *)(pfVar4 + -0xc) = lVar6;
            pfVar4[-0xe] = 2.143915e-39;
            pfVar4[-0xd] = 0.0;
            gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
            ::operator()(&local_32,&local_68,pLVar3,pfVar25 + lVar5 * (long)depth,lVar22,
                         (long)pfVar21,*(long *)(pfVar4 + -0xc),-1.0,*(long *)(pfVar4 + -10),
                         *(long *)(pfVar4 + -8),*(long *)(pfVar4 + -6),*(long *)(pfVar4 + -4));
          }
          lVar23 = lVar23 + 8;
          pfVar9 = pfVar9 + -2;
          pfVar19 = pfVar19 + -8;
          pfVar13 = pfVar13 + ~triStride * 8;
          pfVar4[-2] = 1.12104e-44;
          pfVar4[-1] = 0.0;
          pfVar21 = *(float **)(pfVar4 + -2);
        }
        pfVar12 = pfVar12 + otherStride * lVar16;
      }
      pfVar26 = (float *)((long)pfStack_40 - (long)pfVar2);
      pfStack_40 = pfVar26;
      pfVar12 = local_b8;
      pfVar9 = _other;
      lVar5 = local_c0;
      for (lVar6 = 0; pLVar3 = local_50, lVar6 < (long)pfVar26; lVar6 = lVar6 + lVar24) {
        lVar23 = lVar5;
        if (lVar24 <= lVar5) {
          lVar23 = lVar24;
        }
        if (0 < lVar23) {
          local_58 = pfVar9;
          local_68.m_data = pfVar12;
          local_68.m_stride = triStride;
          pfVar4[-4] = 0.0;
          pfVar4[-3] = 0.0;
          pfVar4[-6] = 2.144273e-39;
          pfVar4[-5] = 0.0;
          gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
          ::operator()(local_31,pLVar3,(const_blas_data_mapper<float,_long,_0> *)&local_68,
                       (long)depth,lVar23,0,*(long *)(pfVar4 + -4));
          local_68.m_data = local_58;
          local_68.m_stride = otherStride;
          pfVar4[-6] = 0.0;
          pfVar4[-5] = 0.0;
          pfVar4[-4] = 0.0;
          pfVar4[-3] = 0.0;
          pfVar4[-8] = -NAN;
          pfVar4[-7] = -NAN;
          pfVar4[-10] = -NAN;
          pfVar4[-9] = -NAN;
          *(long *)(pfVar4 + -0xc) = otherSize;
          pLVar3 = local_50;
          pfVar4[-0xe] = 2.14439e-39;
          pfVar4[-0xd] = 0.0;
          gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
          ::operator()(&local_32,&local_68,pLVar3,pfVar25,lVar23,(long)depth,
                       *(long *)(pfVar4 + -0xc),-1.0,*(long *)(pfVar4 + -10),*(long *)(pfVar4 + -8),
                       *(long *)(pfVar4 + -6),*(long *)(pfVar4 + -4));
          pfVar26 = pfStack_40;
          pfVar4[-2] = 1.12104e-44;
          pfVar4[-1] = 0.0;
          pfVar21 = *(float **)(pfVar4 + -2);
          pfVar9 = local_58;
        }
        pfVar9 = pfVar9 + lVar24;
        pfVar12 = pfVar12 + lVar24;
        lVar5 = lVar5 - lVar24;
      }
      pfVar8 = pfVar8 + -(long)pfVar2;
      local_d0 = (float *)((long)local_d0 + (triStride * 4 ^ 0xfffffffffffffffcU) * (long)pfVar2);
      local_b8 = local_b8 + -((long)pfVar2 * triStride);
      local_c0 = local_c0 - (long)pfVar2;
    }
    pfVar4[-2] = 2.14461e-39;
    pfVar4[-1] = 0.0;
    aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)&blockA_stack_memory_destructor.m_deallocate);
    pfVar4[-2] = 2.144627e-39;
    pfVar4[-1] = 0.0;
    aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)&l3);
    return;
  }
  __assert_fail("incr==1",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/BlasUtil.h"
                ,0xae,
                "Eigen::internal::blas_data_mapper<float, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = float, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
               );
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }